

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# practise3.7.cpp
# Opt level: O1

int deQueue(CycQueue *Q,int *x)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = Q->rear;
  bVar2 = Q->front != iVar1;
  if (bVar2) {
    *x = Q->data[iVar1];
    Q->rear = Q->rear + ((Q->rear + 99) / 100) * -100 + 99;
  }
  return (uint)bVar2;
}

Assistant:

int deQueue(CycQueue &Q, int &x) {
    if(Q.front == Q.rear)
        return 0; //出队失败
    else {
        x = Q.data[Q.rear];
        Q.rear = (Q.rear-1+maxSize)%maxSize; //修改尾指针
        return 1;  //出队成功
    }
}